

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O2

void __thiscall QVersionNumber::SegmentStorage::setListData(SegmentStorage *this,QList<int> *seg)

{
  QArrayDataPointer<int> *this_00;
  
  this_00 = (QArrayDataPointer<int> *)operator_new(0x18);
  QArrayDataPointer<int>::QArrayDataPointer(this_00,&seg->d);
  (this->field_0).pointer_segments = (QList<int> *)this_00;
  return;
}

Assistant:

void QVersionNumber::SegmentStorage::setListData(QList<int> &&seg)
{
    pointer_segments = new QList<int>(std::move(seg));
}